

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O2

bool duckdb::TemplatedBooleanOperation<duckdb::Equals>(Value *left,Value *right)

{
  PhysicalType PVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  __type _Var8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  vector<duckdb::Value,_true> *pvVar13;
  vector<duckdb::Value,_true> *pvVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  long lVar19;
  string *__lhs;
  string *__rhs;
  InternalException *this;
  long lVar20;
  idx_t i;
  ulong uVar21;
  size_type __n;
  float fVar22;
  double dVar23;
  hugeint_t hVar24;
  hugeint_t hVar25;
  LogicalType comparison_type;
  Value left_copy;
  Value right_copy;
  
  right_copy.type_._4_12_ =
       right_copy.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._0_12_;
  left_copy.type_._4_12_ =
       left_copy.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._0_12_;
  bVar4 = LogicalType::operator!=(&left->type_,&right->type_);
  if (bVar4) {
    Value::Value(&left_copy,left);
    Value::Value(&right_copy,right);
    LogicalType::ForceMaxLogicalType(&comparison_type,&left->type_,&right->type_);
    bVar4 = Value::DefaultTryCastAs(&left_copy,&comparison_type,false);
    if ((bVar4) && (bVar4 = Value::DefaultTryCastAs(&right_copy,&comparison_type,false), bVar4)) {
      bVar4 = TemplatedBooleanOperation<duckdb::Equals>(&left_copy,&right_copy);
    }
    else {
      bVar4 = false;
    }
    LogicalType::~LogicalType(&comparison_type);
    Value::~Value(&right_copy);
    Value::~Value(&left_copy);
    return bVar4;
  }
  PVar1 = (left->type_).physical_type_;
  switch(PVar1) {
  case BOOL:
    bVar4 = Value::GetValueUnsafe<bool>(left);
    bVar5 = Value::GetValueUnsafe<bool>(right);
    bVar4 = bVar5 == bVar4;
    break;
  case UINT8:
    uVar6 = Value::GetValueUnsafe<unsigned_char>(left);
    uVar7 = Value::GetValueUnsafe<unsigned_char>(right);
    goto LAB_002ef4e0;
  case INT8:
    uVar6 = Value::GetValueUnsafe<signed_char>(left);
    uVar7 = Value::GetValueUnsafe<signed_char>(right);
LAB_002ef4e0:
    bVar4 = uVar6 == uVar7;
    break;
  case UINT16:
    uVar9 = Value::GetValueUnsafe<unsigned_short>(left);
    uVar10 = Value::GetValueUnsafe<unsigned_short>(right);
    goto LAB_002ef527;
  case INT16:
    uVar9 = Value::GetValueUnsafe<short>(left);
    uVar10 = Value::GetValueUnsafe<short>(right);
LAB_002ef527:
    bVar4 = uVar9 == uVar10;
    break;
  case UINT32:
    uVar11 = Value::GetValueUnsafe<unsigned_int>(left);
    uVar12 = Value::GetValueUnsafe<unsigned_int>(right);
    goto LAB_002ef483;
  case INT32:
    uVar11 = Value::GetValueUnsafe<int>(left);
    uVar12 = Value::GetValueUnsafe<int>(right);
LAB_002ef483:
    bVar4 = uVar11 == uVar12;
    break;
  case UINT64:
    uVar17 = Value::GetValueUnsafe<unsigned_long>(left);
    uVar18 = Value::GetValueUnsafe<unsigned_long>(right);
    goto LAB_002ef43e;
  case INT64:
    uVar17 = Value::GetValueUnsafe<long>(left);
    uVar18 = Value::GetValueUnsafe<long>(right);
LAB_002ef43e:
    bVar4 = uVar17 == uVar18;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_002ef1d6_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&left_copy,"Unimplemented type for value comparison",
               (allocator *)&right_copy);
    InternalException::InternalException(this,(string *)&left_copy);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar22 = Value::GetValueUnsafe<float>(left);
    left_copy.type_._0_4_ = fVar22;
    fVar22 = Value::GetValueUnsafe<float>(right);
    right_copy.type_._0_4_ = fVar22;
    bVar4 = Equals::Operation<float>((float *)&left_copy,(float *)&right_copy);
    break;
  case DOUBLE:
    dVar23 = Value::GetValueUnsafe<double>(left);
    left_copy.type_._0_8_ = dVar23;
    dVar23 = Value::GetValueUnsafe<double>(right);
    right_copy.type_._0_8_ = dVar23;
    bVar4 = Equals::Operation<double>((double *)&left_copy,(double *)&right_copy);
    break;
  case INTERVAL:
    left_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::interval_t>(left);
    right_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::interval_t>(right);
    bVar4 = interval_t::operator==((interval_t *)&left_copy,(interval_t *)&right_copy);
    break;
  case LIST:
    pvVar13 = ListValue::GetChildren(left);
    pvVar14 = ListValue::GetChildren(right);
    __n = 0;
    do {
      lVar19 = (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start;
      lVar20 = (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((__n == lVar19 >> 6) || (__n == lVar20 >> 6)) {
        return lVar19 == lVar20;
      }
      vector<duckdb::Value,_true>::get<true>(pvVar13,__n);
      vector<duckdb::Value,_true>::get<true>(pvVar14,__n);
      pvVar15 = vector<duckdb::Value,_true>::get<true>(pvVar13,__n);
      pvVar16 = vector<duckdb::Value,_true>::get<true>(pvVar14,__n);
      bVar5 = ValueOperations::NotDistinctFrom(pvVar15,pvVar16);
      __n = __n + 1;
      bVar4 = false;
    } while (bVar5);
    break;
  case STRUCT:
    pvVar13 = StructValue::GetChildren(left);
    pvVar14 = StructValue::GetChildren(right);
    uVar21 = 0;
    while( true ) {
      pVVar2 = (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar3 = (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar15 = vector<duckdb::Value,_true>::get<true>(pvVar13,uVar21);
      pvVar16 = vector<duckdb::Value,_true>::get<true>(pvVar14,uVar21);
      if (((long)pVVar2 - (long)pVVar3 >> 6) - 1U <= uVar21) {
        bVar4 = ValueOperations::NotDistinctFrom(pvVar15,pvVar16);
        return bVar4;
      }
      pvVar15 = vector<duckdb::Value,_true>::get<true>(pvVar13,uVar21);
      pvVar16 = vector<duckdb::Value,_true>::get<true>(pvVar14,uVar21);
      bVar4 = ValueOperations::NotDistinctFrom(pvVar15,pvVar16);
      if (!bVar4) break;
      uVar21 = uVar21 + 1;
    }
    bVar4 = false;
    break;
  case ARRAY:
    pvVar13 = ArrayValue::GetChildren(left);
    pvVar14 = ArrayValue::GetChildren(right);
    uVar21 = 0;
    do {
      bVar4 = (ulong)((long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 6) <= uVar21;
      if (bVar4) {
        return bVar4;
      }
      vector<duckdb::Value,_true>::get<true>(pvVar13,uVar21);
      vector<duckdb::Value,_true>::get<true>(pvVar14,uVar21);
      pvVar15 = vector<duckdb::Value,_true>::get<true>(pvVar13,uVar21);
      pvVar16 = vector<duckdb::Value,_true>::get<true>(pvVar14,uVar21);
      bVar5 = ValueOperations::NotDistinctFrom(pvVar15,pvVar16);
      uVar21 = uVar21 + 1;
    } while (bVar5);
    break;
  default:
    if (PVar1 == VARCHAR) {
      __lhs = StringValue::Get_abi_cxx11_(left);
      __rhs = StringValue::Get_abi_cxx11_(right);
      _Var8 = ::std::operator==(__lhs,__rhs);
      return _Var8;
    }
    if (PVar1 == UINT128) {
      left_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(left);
      right_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(right);
      bVar4 = uhugeint_t::operator==((uhugeint_t *)&left_copy,(uhugeint_t *)&right_copy);
    }
    else {
      if (PVar1 != INT128) goto switchD_002ef1d6_caseD_a;
      hVar24 = Value::GetValueUnsafe<duckdb::hugeint_t>(left);
      hVar25 = Value::GetValueUnsafe<duckdb::hugeint_t>(right);
      bVar4 = SUB168((undefined1  [16])hVar24 ^ (undefined1  [16])hVar25,8) == 0 &&
              SUB168((undefined1  [16])hVar24 ^ (undefined1  [16])hVar25,0) == 0;
    }
  }
  return bVar4;
}

Assistant:

static bool TemplatedBooleanOperation(const Value &left, const Value &right) {
	const auto &left_type = left.type();
	const auto &right_type = right.type();
	if (left_type != right_type) {
		Value left_copy = left;
		Value right_copy = right;

		auto comparison_type = LogicalType::ForceMaxLogicalType(left_type, right_type);
		if (!left_copy.DefaultTryCastAs(comparison_type) || !right_copy.DefaultTryCastAs(comparison_type)) {
			return false;
		}
		D_ASSERT(left_copy.type() == right_copy.type());
		return TemplatedBooleanOperation<OP>(left_copy, right_copy);
	}
	switch (left_type.InternalType()) {
	case PhysicalType::BOOL:
		return OP::Operation(left.GetValueUnsafe<bool>(), right.GetValueUnsafe<bool>());
	case PhysicalType::INT8:
		return OP::Operation(left.GetValueUnsafe<int8_t>(), right.GetValueUnsafe<int8_t>());
	case PhysicalType::INT16:
		return OP::Operation(left.GetValueUnsafe<int16_t>(), right.GetValueUnsafe<int16_t>());
	case PhysicalType::INT32:
		return OP::Operation(left.GetValueUnsafe<int32_t>(), right.GetValueUnsafe<int32_t>());
	case PhysicalType::INT64:
		return OP::Operation(left.GetValueUnsafe<int64_t>(), right.GetValueUnsafe<int64_t>());
	case PhysicalType::UINT8:
		return OP::Operation(left.GetValueUnsafe<uint8_t>(), right.GetValueUnsafe<uint8_t>());
	case PhysicalType::UINT16:
		return OP::Operation(left.GetValueUnsafe<uint16_t>(), right.GetValueUnsafe<uint16_t>());
	case PhysicalType::UINT32:
		return OP::Operation(left.GetValueUnsafe<uint32_t>(), right.GetValueUnsafe<uint32_t>());
	case PhysicalType::UINT64:
		return OP::Operation(left.GetValueUnsafe<uint64_t>(), right.GetValueUnsafe<uint64_t>());
	case PhysicalType::UINT128:
		return OP::Operation(left.GetValueUnsafe<uhugeint_t>(), right.GetValueUnsafe<uhugeint_t>());
	case PhysicalType::INT128:
		return OP::Operation(left.GetValueUnsafe<hugeint_t>(), right.GetValueUnsafe<hugeint_t>());
	case PhysicalType::FLOAT:
		return OP::Operation(left.GetValueUnsafe<float>(), right.GetValueUnsafe<float>());
	case PhysicalType::DOUBLE:
		return OP::Operation(left.GetValueUnsafe<double>(), right.GetValueUnsafe<double>());
	case PhysicalType::INTERVAL:
		return OP::Operation(left.GetValueUnsafe<interval_t>(), right.GetValueUnsafe<interval_t>());
	case PhysicalType::VARCHAR:
		return OP::Operation(StringValue::Get(left), StringValue::Get(right));
	case PhysicalType::STRUCT: {
		auto &left_children = StructValue::GetChildren(left);
		auto &right_children = StructValue::GetChildren(right);
		// this should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());
		idx_t i = 0;
		for (; i < left_children.size() - 1; ++i) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return ValuePositionComparator::Final<OP>(left_children[i], right_children[i]);
	}
	case PhysicalType::LIST: {
		auto &left_children = ListValue::GetChildren(left);
		auto &right_children = ListValue::GetChildren(right);
		for (idx_t pos = 0;; ++pos) {
			if (pos == left_children.size() || pos == right_children.size()) {
				return ValuePositionComparator::TieBreak<OP>(left_children.size(), right_children.size());
			}
			if (ValuePositionComparator::Definite<OP>(left_children[pos], right_children[pos])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[pos], right_children[pos])) {
				return false;
			}
		}
		return false;
	}
	case PhysicalType::ARRAY: {
		auto &left_children = ArrayValue::GetChildren(left);
		auto &right_children = ArrayValue::GetChildren(right);

		// Should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());

		for (idx_t i = 0; i < left_children.size(); i++) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return true;
	}
	default:
		throw InternalException("Unimplemented type for value comparison");
	}
}